

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineViewportDepthClampControlCreateInfoEXT *info,ScratchAllocator *alloc
          ,DynamicStateInfo *dynamic_state)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  void *pvVar3;
  VkDepthClampRangeEXT *pVVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  
  puVar5 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar5 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)info;
    pvVar3 = info->pNext;
    pVVar4 = info->pDepthClampRange;
    puVar5[2] = *(undefined8 *)&info->depthClampMode;
    puVar5[3] = pVVar4;
    *puVar5 = uVar2;
    puVar5[1] = pvVar3;
  }
  if ((((dynamic_state == (DynamicStateInfo *)0x0) || (dynamic_state->depth_clamp_range == false))
      && (*(int *)(puVar5 + 2) == 1)) &&
     (puVar1 = (undefined8 *)puVar5[3], puVar1 != (undefined8 *)0x0)) {
    puVar6 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,8,0x10);
    if (puVar6 != (undefined8 *)0x0) {
      *puVar6 = *puVar1;
    }
    puVar5[3] = puVar6;
  }
  else {
    puVar5[3] = 0;
  }
  return puVar5;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineViewportDepthClampControlCreateInfoEXT *info, ScratchAllocator &alloc,
                                             const DynamicStateInfo *dynamic_state)
{
	auto *clamp_control = copy(info, 1, alloc);
	if ((!dynamic_state || !dynamic_state->depth_clamp_range) &&
	    clamp_control->depthClampMode == VK_DEPTH_CLAMP_MODE_USER_DEFINED_RANGE_EXT &&
	    clamp_control->pDepthClampRange)
	{
		clamp_control->pDepthClampRange = copy(clamp_control->pDepthClampRange, 1, alloc);
	}
	else
		clamp_control->pDepthClampRange = nullptr;

	return clamp_control;
}